

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Textures::BindUnitTest::CreateTextures(BindUnitTest *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6f8))(4,this->m_to);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1b96);
  (**(code **)(lVar3 + 0xff0))(0xcf5,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1b9a);
  (**(code **)(lVar3 + 0xff0))(0xd05,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1b9d);
  (**(code **)(lVar3 + 0xb8))(0xde1,this->m_to[0]);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1ba1);
  (**(code **)(lVar3 + 0x1310))(0xde1,0,0x8229,2,3,0,0x1903,0x1401,&s_texture_data_r);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexImage1D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1ba5);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2801,0x2600);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexParameteri call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1ba9);
  (**(code **)(lVar3 + 0xb8))(0xde1,this->m_to[1]);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1bad);
  (**(code **)(lVar3 + 0x1310))(0xde1,0,0x8229,2,3,0,0x1903,0x1401,&s_texture_data_g);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexImage1D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1bb1);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2801,0x2600);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexParameteri call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1bb5);
  (**(code **)(lVar3 + 0xb8))(0xde1,this->m_to[2]);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1bb9);
  (**(code **)(lVar3 + 0x1310))(0xde1,0,0x8229,2,3,0,0x1903,0x1401,&s_texture_data_b);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexImage1D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1bbd);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2801,0x2600);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexParameteri call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1bc1);
  (**(code **)(lVar3 + 0xb8))(0xde1,this->m_to[3]);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1bc5);
  (**(code **)(lVar3 + 0x1310))(0xde1,0,0x8229,2,3,0,0x1903,0x1401,&s_texture_data_a);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexImage1D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1bc9);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2801,0x2600);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexParameteri call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1bcd);
  return;
}

Assistant:

void BindUnitTest::CreateTextures()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare texture. */
	gl.genTextures(4, m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	/* Setup pixel sotre modes.*/
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, sizeof(glw::GLubyte));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	gl.pixelStorei(GL_PACK_ALIGNMENT, sizeof(glw::GLubyte));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	/* Red texture. */
	gl.bindTexture(GL_TEXTURE_2D, m_to[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.texImage2D(GL_TEXTURE_2D, 0, GL_R8, s_texture_width, s_texture_height, 0, GL_RED, GL_UNSIGNED_BYTE,
				  s_texture_data_r);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D has failed");

	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri call failed.");

	/* Green texture. */
	gl.bindTexture(GL_TEXTURE_2D, m_to[1]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.texImage2D(GL_TEXTURE_2D, 0, GL_R8, s_texture_width, s_texture_height, 0, GL_RED, GL_UNSIGNED_BYTE,
				  s_texture_data_g);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D has failed");

	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri call failed.");

	/* Blue texture. */
	gl.bindTexture(GL_TEXTURE_2D, m_to[2]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.texImage2D(GL_TEXTURE_2D, 0, GL_R8, s_texture_width, s_texture_height, 0, GL_RED, GL_UNSIGNED_BYTE,
				  s_texture_data_b);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D has failed");

	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri call failed.");

	/* Alpha texture. */
	gl.bindTexture(GL_TEXTURE_2D, m_to[3]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.texImage2D(GL_TEXTURE_2D, 0, GL_R8, s_texture_width, s_texture_height, 0, GL_RED, GL_UNSIGNED_BYTE,
				  s_texture_data_a);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D has failed");

	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri call failed.");
}